

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCanon.c
# Opt level: O0

Ivy_Obj_t * Ivy_CanonExor(Ivy_Man_t *p,Ivy_Obj_t *pObj0,Ivy_Obj_t *pObj1)

{
  uint uVar1;
  uint uVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *p1;
  int fCompl;
  Ivy_Obj_t *pResult;
  Ivy_Obj_t *pGhost;
  Ivy_Obj_t *pObj1_local;
  Ivy_Obj_t *pObj0_local;
  Ivy_Man_t *p_local;
  
  uVar1 = Ivy_IsComplement(pObj0);
  uVar2 = Ivy_IsComplement(pObj1);
  pIVar3 = Ivy_Regular(pObj0);
  p1 = Ivy_Regular(pObj1);
  pIVar3 = Ivy_ObjCreateGhost(p,pIVar3,p1,IVY_EXOR,IVY_INIT_NONE);
  pIVar3 = Ivy_CanonPair_rec(p,pIVar3);
  pIVar3 = Ivy_NotCond(pIVar3,uVar1 ^ uVar2);
  return pIVar3;
}

Assistant:

Ivy_Obj_t * Ivy_CanonExor( Ivy_Man_t * p, Ivy_Obj_t * pObj0, Ivy_Obj_t * pObj1 )
{
    Ivy_Obj_t * pGhost, * pResult;
    int fCompl = Ivy_IsComplement(pObj0) ^ Ivy_IsComplement(pObj1);
    pObj0 = Ivy_Regular(pObj0);
    pObj1 = Ivy_Regular(pObj1);
    pGhost = Ivy_ObjCreateGhost( p, pObj0, pObj1, IVY_EXOR, IVY_INIT_NONE );
    pResult = Ivy_CanonPair_rec( p, pGhost );
    return Ivy_NotCond( pResult, fCompl );
}